

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O2

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> * __thiscall
chaiscript::dispatch::detail::
build_param_type_list<std::__cxx11::string_const&,henson::BaseCoroutine_const&>
          (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
           *__return_storage_ptr__,detail *this,
          _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_BaseCoroutine_ptr
          *param_1)

{
  initializer_list<chaiscript::Type_Info> __l;
  allocator_type local_39;
  Type_Info local_38;
  pointer_____offset_0x10___ *local_20;
  pointer_____offset_0x10___ *local_18;
  uint local_10;
  
  local_38.m_type_info = (type_info *)&std::__cxx11::string::typeinfo;
  local_38.m_bare_type_info = (type_info *)&std::__cxx11::string::typeinfo;
  local_38.m_flags = 3;
  local_20 = &henson::BaseCoroutine::typeinfo;
  local_18 = &henson::BaseCoroutine::typeinfo;
  __l._M_len = 2;
  __l._M_array = &local_38;
  local_10 = local_38.m_flags;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (__return_storage_ptr__,__l,&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Type_Info> build_param_type_list(Ret (*)(Params...))
        {
          /// \note somehow this is responsible for a large part of the code generation
          return { user_type<Ret>(), user_type<Params>()... };
        }